

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantInnerTriangleSetCase::compare
          (InvariantInnerTriangleSetCase *this,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsA,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsB,
          int param_3)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  ostringstream *poVar3;
  float fVar4;
  TessPrimitiveType TVar5;
  pointer pVVar6;
  pointer pVVar7;
  TestLog *pTVar8;
  uint uVar9;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *psVar10;
  long lVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  ulong uVar14;
  long *plVar15;
  long *plVar16;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *pvVar17;
  Vector<tcu::Vector<float,_3>,_3> *b;
  Vector<tcu::Vector<float,_3>,_3> *b_00;
  ulong uVar18;
  char cVar19;
  long lVar20;
  long lVar21;
  _Link_type p_Var22;
  bool bVar23;
  bool bVar24;
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  TestLog *local_268;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *local_260;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *local_258;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *local_250;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *local_248;
  undefined1 *local_240;
  undefined8 local_238;
  undefined1 local_230;
  undefined7 uStack_22f;
  _Link_type local_220;
  float local_218;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_210;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_1e0;
  undefined1 local_1b0 [12];
  _Link_type local_1a4;
  float local_19c;
  _Base_ptr local_198;
  float local_190;
  undefined1 local_18c [84];
  ios_base local_138 [264];
  
  TVar5 = (this->super_PrimitiveSetInvarianceCase).m_primitiveType;
  local_248 = coordsB;
  if (TVar5 == TESSPRIMITIVETYPE_QUADS) {
    local_258 = (set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                 *)((long)(coordsA->
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(coordsA->
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    local_260 = (set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                 *)((long)(coordsB->
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(coordsB->
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    pTVar8 = ((this->super_PrimitiveSetInvarianceCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e0._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e0._M_t._M_impl._0_1_ = 0;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_210._M_t._M_impl.super__Rb_tree_header._M_header;
    local_210._M_t._M_impl._0_1_ = 0;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_210._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var22 = (_Link_type)coordsA;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar23 = true;
    do {
      bVar24 = bVar23;
      psVar10 = local_260;
      if (bVar24) {
        psVar10 = local_258;
      }
      local_250 = &local_210;
      if (bVar24) {
        local_250 = &local_1e0;
      }
      uVar9 = (int)((ulong)psVar10 >> 2) * -0x55555555;
      if (2 < (int)uVar9) {
        uVar18 = 0;
        do {
          lVar11 = uVar18 * 0x300000000;
          pvVar17 = local_248;
          if (bVar24) {
            pvVar17 = coordsA;
          }
          pVVar6 = (pvVar17->
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar21 = lVar11 + 0x100000000 >> 0x20;
          local_218 = pVVar6[lVar21].m_data[2];
          local_220 = *(_Link_type *)pVVar6[lVar21].m_data;
          lVar21 = lVar11 + 0x200000000 >> 0x20;
          local_1b0._8_4_ = pVVar6[lVar11 >> 0x20].m_data[2];
          local_1b0._0_8_ = *(TestLog **)pVVar6[lVar11 >> 0x20].m_data;
          local_19c = local_218;
          local_1a4 = local_220;
          local_190 = pVVar6[lVar21].m_data[2];
          local_198 = *(_Base_ptr *)pVVar6[lVar21].m_data;
          uVar14 = 0;
          bVar23 = false;
          p_Var22 = local_220;
          do {
            p_Var22 = (_Link_type)CONCAT71((int7)((ulong)p_Var22 >> 8),1);
            lVar11 = 0;
            do {
              fVar4 = *(float *)(local_1b0 + lVar11 * 4 + uVar14 * 0xc);
              if (((fVar4 == 0.0) && (!NAN(fVar4))) || ((fVar4 == 1.0 && (!NAN(fVar4))))) {
                if (bVar23) goto LAB_003e512a;
                goto LAB_003e515a;
              }
              lVar11 = 1;
              cVar19 = (char)p_Var22;
              p_Var22 = (_Link_type)0x0;
            } while (cVar19 != '\0');
            bVar23 = 1 < uVar14;
            uVar14 = uVar14 + 1;
          } while (uVar14 != 3);
LAB_003e512a:
          p_Var22 = (_Link_type)local_1b0;
          std::
          __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>>>
                    (p_Var22,local_18c);
          std::
          set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
          ::insert(local_250,(value_type *)p_Var22);
LAB_003e515a:
          uVar18 = uVar18 + 1;
        } while (uVar18 != (ulong)uVar9 / 3);
      }
      bVar23 = false;
    } while (bVar24);
    p_Var1 = &local_1e0._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &local_210._M_t._M_impl.super__Rb_tree_header;
    bVar23 = true;
    p_Var12 = local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var13 = local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var2
        && (_Rb_tree_header *)local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
           p_Var1) goto LAB_003e5765;
    do {
      bVar24 = (_Rb_tree_header *)p_Var13 == p_Var2;
      bVar23 = (_Rb_tree_header *)p_Var12 == p_Var1;
      if ((bVar23) || ((_Rb_tree_header *)p_Var13 == p_Var2)) {
LAB_003e5299:
        poVar3 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = pTVar8;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,
                   "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                   ,0x5a);
        local_240 = &local_230;
        local_238 = 0;
        local_230 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_240);
        local_2a8 = &local_298;
        plVar16 = plVar15 + 2;
        if ((long *)*plVar15 == plVar16) {
          local_298 = *plVar16;
          lStack_290 = plVar15[3];
        }
        else {
          local_298 = *plVar16;
          local_2a8 = (long *)*plVar15;
        }
        local_2a0 = plVar15[1];
        *plVar15 = (long)plVar16;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_2a8);
        plVar16 = plVar15 + 2;
        if ((long *)*plVar15 == plVar16) {
          local_278 = *plVar16;
          lStack_270 = plVar15[3];
          local_288 = &local_278;
        }
        else {
          local_278 = *plVar16;
          local_288 = (long *)*plVar15;
        }
        local_280 = plVar15[1];
        *plVar15 = (long)plVar16;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_288,local_280);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_288 != &local_278) {
          operator_delete(local_288,local_278 + 1);
        }
        if (local_2a8 != &local_298) {
          operator_delete(local_2a8,local_298 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_138);
        if ((bVar23) ||
           ((!bVar24 &&
            (bVar23 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                      ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                                    *)(p_Var12 + 1),
                                   (Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1),b_00), !bVar23)
            ))) {
          poVar3 = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = pTVar8;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"Note: e.g. triangle ",0x14);
          tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3," exists for second case but not for first",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          poVar3 = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = pTVar8;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"Note: e.g. triangle ",0x14);
          tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3," exists for first case but not for second",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        goto LAB_003e5750;
      }
      p_Var22 = (_Link_type)(p_Var13 + 1);
      bVar23 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                         ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1),
                          (Vector<tcu::Vector<float,_3>,_3> *)p_Var22);
      if (!bVar23) {
        bVar23 = false;
        bVar24 = false;
        goto LAB_003e5299;
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while (((_Rb_tree_header *)p_Var12 != p_Var1) || ((_Rb_tree_header *)p_Var13 != p_Var2));
  }
  else {
    if (TVar5 != TESSPRIMITIVETYPE_TRIANGLES) {
      return false;
    }
    local_260 = (set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                 *)((long)(coordsA->
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(coordsA->
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    pVVar6 = (coordsB->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pVVar7 = (coordsB->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_268 = ((this->super_PrimitiveSetInvarianceCase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e0._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e0._M_t._M_impl._0_1_ = 0;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_210._M_t._M_impl.super__Rb_tree_header._M_header;
    local_210._M_t._M_impl._0_1_ = 0;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_210._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_250 = (set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                 *)coordsA;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar23 = true;
    do {
      bVar24 = bVar23;
      psVar10 = (set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                 *)((long)pVVar6 - (long)pVVar7);
      if (bVar24) {
        psVar10 = local_260;
      }
      local_258 = &local_210;
      if (bVar24) {
        local_258 = &local_1e0;
      }
      uVar9 = (int)((ulong)psVar10 >> 2) * -0x55555555;
      if (2 < (int)uVar9) {
        uVar18 = 0;
        do {
          lVar11 = uVar18 * 0x300000000;
          psVar10 = (set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                     *)coordsB;
          if (bVar24) {
            psVar10 = local_250;
          }
          lVar21 = *(long *)&(psVar10->_M_t)._M_impl;
          lVar20 = lVar11 + 0x100000000 >> 0x20;
          local_218 = *(float *)(lVar21 + 8 + lVar20 * 0xc);
          local_220 = *(_Link_type *)(lVar21 + lVar20 * 0xc);
          lVar20 = lVar11 + 0x200000000 >> 0x20;
          local_1b0._8_4_ = *(float *)(lVar21 + 8 + (lVar11 >> 0x20) * 0xc);
          local_1b0._0_8_ = *(TestLog **)(lVar21 + (lVar11 >> 0x20) * 0xc);
          local_19c = local_218;
          local_1a4 = local_220;
          local_190 = *(float *)(lVar21 + 8 + lVar20 * 0xc);
          local_198 = *(_Base_ptr *)(lVar21 + lVar20 * 0xc);
          uVar14 = 0;
          bVar23 = false;
          p_Var22 = (_Link_type)local_1b0;
          do {
            coordsA = (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)0x0;
            do {
              fVar4 = *(float *)((p_Var22->_M_storage)._M_storage + (long)coordsA * 4 + -0x20);
              if ((fVar4 == 0.0) && (!NAN(fVar4))) {
                if (bVar23) goto LAB_003e4e8b;
                goto LAB_003e4eab;
              }
              coordsA = (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        ((long)&(((_Link_type)coordsA)->super__Rb_tree_node_base)._M_color + 1);
            } while ((_Link_type)coordsA != (_Link_type)0x3);
            bVar23 = 1 < uVar14;
            uVar14 = uVar14 + 1;
            p_Var22 = (_Link_type)((long)&(p_Var22->super__Rb_tree_node_base)._M_parent + 4);
          } while (uVar14 != 3);
LAB_003e4e8b:
          std::
          __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>>>
                    ((_Link_type)local_1b0,local_18c);
          coordsA = (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                    local_1b0;
          std::
          set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
          ::insert(local_258,(value_type *)local_1b0);
LAB_003e4eab:
          uVar18 = uVar18 + 1;
        } while (uVar18 != (ulong)uVar9 / 3);
      }
      bVar23 = false;
    } while (bVar24);
    p_Var1 = &local_1e0._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &local_210._M_t._M_impl.super__Rb_tree_header;
    bVar23 = true;
    p_Var12 = local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var22 = (_Link_type)coordsA;
    p_Var13 = local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var2
        && (_Rb_tree_header *)local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
           p_Var1) goto LAB_003e5765;
    do {
      bVar24 = (_Rb_tree_header *)p_Var13 == p_Var2;
      bVar23 = (_Rb_tree_header *)p_Var12 == p_Var1;
      if ((bVar23) || ((_Rb_tree_header *)p_Var13 == p_Var2)) {
LAB_003e520d:
        poVar3 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = local_268;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,
                   "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                   ,0x5a);
        local_240 = &local_230;
        local_238 = 0;
        local_230 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_240);
        local_2a8 = &local_298;
        plVar16 = plVar15 + 2;
        if ((long *)*plVar15 == plVar16) {
          local_298 = *plVar16;
          lStack_290 = plVar15[3];
        }
        else {
          local_298 = *plVar16;
          local_2a8 = (long *)*plVar15;
        }
        local_2a0 = plVar15[1];
        *plVar15 = (long)plVar16;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_2a8);
        plVar16 = plVar15 + 2;
        if ((long *)*plVar15 == plVar16) {
          local_278 = *plVar16;
          lStack_270 = plVar15[3];
          local_288 = &local_278;
        }
        else {
          local_278 = *plVar16;
          local_288 = (long *)*plVar15;
        }
        local_280 = plVar15[1];
        *plVar15 = (long)plVar16;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_288,local_280);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_288 != &local_278) {
          operator_delete(local_288,local_278 + 1);
        }
        if (local_2a8 != &local_298) {
          operator_delete(local_2a8,local_298 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_138);
        if ((bVar23) ||
           ((!bVar24 &&
            (bVar23 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                      ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                                    *)(p_Var12 + 1),
                                   (Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1),b), !bVar23))))
        {
          poVar3 = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = local_268;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"Note: e.g. triangle ",0x14);
          tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3," exists for second case but not for first",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          poVar3 = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = local_268;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"Note: e.g. triangle ",0x14);
          tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3," exists for first case but not for second",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
LAB_003e5750:
        p_Var22 = (_Link_type)&std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        bVar23 = false;
        goto LAB_003e5765;
      }
      p_Var22 = (_Link_type)(p_Var13 + 1);
      bVar23 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                         ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1),
                          (Vector<tcu::Vector<float,_3>,_3> *)p_Var22);
      if (!bVar23) {
        bVar23 = false;
        bVar24 = false;
        goto LAB_003e520d;
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while (((_Rb_tree_header *)p_Var12 != p_Var1) || ((_Rb_tree_header *)p_Var13 != p_Var2));
  }
  bVar23 = true;
LAB_003e5765:
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,p_Var22);
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,p_Var22);
  return bVar23;
}

Assistant:

virtual bool compare (const vector<Vec3>& coordsA, const vector<Vec3>& coordsB, int) const
	{
		if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			return compareTriangleSets(coordsA, coordsB, m_testCtx.getLog(), IsInnerTriangleTriangle(), "outer triangles");
		else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
			return compareTriangleSets(coordsA, coordsB, m_testCtx.getLog(), IsInnerQuadTriangle(), "outer triangles");
		else
		{
			DE_ASSERT(false);
			return false;
		}
	}